

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O3

int mapSwampRiver(Layer *l,int *out,int x,int z,int w,int h)

{
  uint64_t uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  iVar3 = (*l->p->getMap)(l->p,out,x,z,w,h);
  if (iVar3 == 0) {
    if (0 < h) {
      uVar1 = l->startSeed;
      lVar8 = 0;
      do {
        if (0 < w) {
          lVar9 = (long)(z + (int)lVar8);
          lVar6 = 0;
          do {
            uVar7 = out[lVar6];
            if ((uVar7 < 0x17) && ((0x600040U >> (uVar7 & 0x1f) & 1) != 0)) {
              lVar4 = (long)(x + (int)lVar6);
              lVar5 = uVar1 + lVar4;
              lVar5 = (lVar5 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar5 + lVar9;
              lVar4 = (lVar5 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar5 + lVar4;
              lVar5 = (lVar4 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar4 + lVar9;
              auVar2._8_8_ = lVar5 >> 0x3f;
              auVar2._0_8_ = lVar5 >> 0x18;
              if (SUB168(auVar2 % SEXT816((long)((ulong)(uVar7 != 6) * 2 + 6)),0) == 0) {
                uVar7 = 7;
              }
              out[lVar6] = uVar7;
            }
            lVar6 = lVar6 + 1;
          } while (w != lVar6);
        }
        lVar8 = lVar8 + 1;
        out = out + w;
      } while (lVar8 != h);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mapSwampRiver(const Layer * l, int * out, int x, int z, int w, int h)
{
    int64_t i, j;
    int err = l->p->getMap(l->p, out, x, z, w, h);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int v = out[i + j*w];
            if (v != swamp && v != jungle && v != jungle_hills)
                continue;

            cs = getChunkSeed(ss, i + x, j + z);
            if (mcFirstIsZero(cs, (v == swamp) ? 6 : 8))
                v = river;

            out[i + j*w] = v;
        }
    }

    return 0;
}